

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Texture.cc
# Opt level: O2

Texture * __thiscall SDL2pp::Texture::operator=(Texture *this,Texture *other)

{
  if (other != this) {
    if (this->texture_ != (SDL_Texture *)0x0) {
      SDL_DestroyTexture();
    }
    this->texture_ = other->texture_;
    other->texture_ = (SDL_Texture *)0x0;
  }
  return this;
}

Assistant:

Texture& Texture::operator=(Texture&& other) noexcept {
	if (&other == this)
		return *this;
	if (texture_ != nullptr)
		SDL_DestroyTexture(texture_);
	texture_ = other.texture_;
	other.texture_ = nullptr;
	return *this;
}